

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageEdgeCircumcenterSign<long_double>
              (Vector3<long_double> *x0,Vector3<long_double> *x1,Vector3<long_double> *a,
              Vector3<long_double> *b,Vector3<long_double> *c,int abc_sign)

{
  BasicVector<Vector3,_long_double,_3UL> *this;
  D *b_00;
  BasicVector<Vector3,_long_double,_3UL> *this_00;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar1;
  longdouble in_ST2;
  __type_conflict _Var2;
  __type_conflict _Var3;
  int local_1d4;
  longdouble result_error;
  longdouble nx_error;
  longdouble nx_len;
  longdouble z_len;
  longdouble result;
  D local_e8;
  undefined1 local_b8 [8];
  Vector3<long_double> nx;
  Vector3<long_double> z;
  longdouble z_error;
  longdouble T_ERR;
  int abc_sign_local;
  Vector3<long_double> *c_local;
  Vector3<long_double> *b_local;
  Vector3<long_double> *a_local;
  Vector3<long_double> *x1_local;
  Vector3<long_double> *x0_local;
  
  this = (BasicVector<Vector3,_long_double,_3UL> *)((long)nx.c_ + 0x28);
  GetCircumcenter<long_double>((Vector3<long_double> *)this,a,b,c,(longdouble *)((long)z.c_ + 0x28))
  ;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (&local_e8,(BasicVector<Vector3,_long_double,_3UL> *)x0,x1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((D *)((long)&result + 8),(BasicVector<Vector3,_long_double,_3UL> *)x0,x1);
  Vector3<long_double>::CrossProd
            ((Vector3<long_double> *)local_b8,&local_e8,(D *)((long)&result + 8));
  this_00 = this;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)local_b8,this,b_00);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)this,this_00);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)local_b8,this_00);
  _Var2 = std::sqrt<int>(3);
  _Var3 = std::sqrt<int>(3);
  lVar1 = in_ST1 * ((longdouble)5.421011e-20 *
                    ((longdouble)(_Var3 * 32.0 * 1.1102230246251565e-16) +
                    in_ST2 * (longdouble)(_Var2 + _Var2 + 1.0)) + (longdouble)1.6263033e-19 * in_ST2
                   ) + stack0xffffffffffffffa8 * in_ST2;
  if ((longdouble)abc_sign * in_ST0 <= lVar1) {
    local_1d4 = -(uint)((longdouble)abc_sign * in_ST0 < -lVar1);
  }
  else {
    local_1d4 = 1;
  }
  return local_1d4;
}

Assistant:

int TriageEdgeCircumcenterSign(const Vector3<T>& x0, const Vector3<T>& x1,
                               const Vector3<T>& a, const Vector3<T>& b,
                               const Vector3<T>& c, int abc_sign) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Compute the circumcenter Z of triangle ABC, and then test which side of
  // edge X it lies on.
  T z_error;
  Vector3<T> z = GetCircumcenter(a, b, c, &z_error);
  Vector3<T> nx = (x0 - x1).CrossProd(x0 + x1);
  // If the sign of triangle ABC is negative, then we have computed -Z and the
  // result should be negated.
  T result = abc_sign * nx.DotProd(z);

  T z_len = z.Norm();
  T nx_len = nx.Norm();
  T nx_error = ((1 + 2 * sqrt(3)) * nx_len + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T result_error = ((3 * T_ERR * nx_len + nx_error) * z_len + z_error * nx_len);
  return (result > result_error) ? 1 : (result < -result_error) ? -1 : 0;
}